

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict type_qual(c2m_ctx_t c2m_ctx,int no_err_p)

{
  ushort uVar1;
  token_t ptVar2;
  node_t_conflict n;
  node_code_t nc;
  undefined8 uVar3;
  char *pcVar4;
  pos_t p;
  
  ptVar2 = c2m_ctx->parse_ctx->curr_token;
  uVar1 = *(ushort *)ptVar2;
  if (uVar1 < 0x12e) {
    if (uVar1 == 0x114) {
      pcVar4 = (ptVar2->pos).fname;
      uVar3._0_4_ = (ptVar2->pos).lno;
      uVar3._4_4_ = (ptVar2->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_ATOMIC;
    }
    else {
      if (uVar1 != 0x11e) {
LAB_001976d1:
        if (c2m_ctx->parse_ctx->record_level != 0) {
          return &err_struct;
        }
        syntax_error(c2m_ctx,"a type qualifier");
        return &err_struct;
      }
      pcVar4 = (ptVar2->pos).fname;
      uVar3._0_4_ = (ptVar2->pos).lno;
      uVar3._4_4_ = (ptVar2->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      nc = N_CONST;
    }
  }
  else if (uVar1 == 0x12e) {
    pcVar4 = (ptVar2->pos).fname;
    uVar3._0_4_ = (ptVar2->pos).lno;
    uVar3._4_4_ = (ptVar2->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    nc = N_RESTRICT;
  }
  else {
    if (uVar1 != 0x13b) goto LAB_001976d1;
    pcVar4 = (ptVar2->pos).fname;
    uVar3._0_4_ = (ptVar2->pos).lno;
    uVar3._4_4_ = (ptVar2->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    nc = N_VOLATILE;
  }
  n = new_node(c2m_ctx,nc);
  p.lno = (int)uVar3;
  p.ln_pos = (int)((ulong)uVar3 >> 0x20);
  p.fname = pcVar4;
  add_pos(c2m_ctx,n,p);
  return n;
}

Assistant:

D (type_qual) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;
  pos_t pos;

  if (MP (T_CONST, pos)) {
    r = new_pos_node (c2m_ctx, N_CONST, pos);
  } else if (MP (T_RESTRICT, pos)) {
    r = new_pos_node (c2m_ctx, N_RESTRICT, pos);
  } else if (MP (T_VOLATILE, pos)) {
    r = new_pos_node (c2m_ctx, N_VOLATILE, pos);
  } else if (MP (T_ATOMIC, pos)) {
    r = new_pos_node (c2m_ctx, N_ATOMIC, pos);
  } else {
    if (record_level == 0) syntax_error (c2m_ctx, "a type qualifier");
    r = err_node;
  }
  return r;
}